

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  long lVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  sqlite3_io_methods *psVar9;
  sqlite3_io_methods *psVar10;
  sqlite3_io_methods *psVar11;
  sqlite3_io_methods *psVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  sqlite3_file sVar17;
  sqlite3_io_methods *psVar18;
  long lVar19;
  sqlite3_file sVar20;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar16 = *(int *)((long)&pJfd[1].pMethods + 4);
  if (((long)iVar16 < 1) || (iAmt + iOfst <= (long)iVar16)) {
    if ((0 < iOfst) && (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst)) {
      memjrnlTruncate(pJfd,iOfst);
    }
    if ((iOfst == 0) && (pJfd[2].pMethods != (sqlite3_io_methods *)0x0)) {
      memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
LAB_00137c00:
      iVar14 = 0;
    }
    else {
      do {
        if (iAmt < 1) goto LAB_00137c00;
        sVar20.pMethods = pJfd[4].pMethods;
        iVar16 = *(int *)&pJfd[1].pMethods;
        lVar19 = (long)pJfd[3].pMethods % (long)iVar16;
        iVar14 = iVar16 - (int)lVar19;
        if (iAmt < iVar14) {
          iVar14 = iAmt;
        }
        if (lVar19 == 0) {
          sVar17.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar16 + 8);
          if (sVar17.pMethods != (sqlite3_io_methods *)0x0) {
            if (sVar20.pMethods == (sqlite3_io_methods *)0x0) {
              sVar20.pMethods = (sqlite3_io_methods *)(pJfd + 2);
            }
            *(undefined8 *)sVar17.pMethods = 0;
            *(sqlite3_io_methods **)sVar20.pMethods = sVar17.pMethods;
            pJfd[4].pMethods = sVar17.pMethods;
            sVar20.pMethods = sVar17.pMethods;
          }
          if (sVar17.pMethods != (sqlite3_io_methods *)0x0) goto LAB_00137ba9;
          bVar13 = false;
        }
        else {
LAB_00137ba9:
          __n = (size_t)iVar14;
          memcpy((void *)((long)&(sVar20.pMethods)->xClose + lVar19),zBuf,__n);
          zBuf = (void *)((long)zBuf + __n);
          iAmt = iAmt - iVar14;
          pJfd[3].pMethods = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
          bVar13 = true;
        }
      } while (bVar13);
      iVar14 = 0xc0a;
    }
LAB_00137ccd:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return iVar14;
    }
  }
  else {
    psVar3 = pJfd->pMethods;
    iVar1 = *(int *)&pJfd[1].pMethods;
    psVar4 = pJfd[2].pMethods;
    psVar5 = pJfd[3].pMethods;
    psVar6 = pJfd[6].pMethods;
    psVar11 = pJfd[4].pMethods;
    psVar12 = pJfd[5].pMethods;
    psVar7 = pJfd[7].pMethods;
    psVar8 = pJfd[8].pMethods;
    psVar9 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar15 = 0;
    iVar14 = (*psVar8->xSync)((sqlite3_file *)psVar8,(int)psVar9);
    if (iVar14 == 0) {
      if (psVar4 != (sqlite3_io_methods *)0x0) {
        lVar19 = 0;
        psVar18 = psVar4;
        iVar14 = iVar1;
        do {
          if ((long)psVar5 < iVar14 + lVar19) {
            iVar14 = (int)psVar5 - (int)lVar19;
          }
          iVar15 = (*pJfd->pMethods->xWrite)(pJfd,&psVar18->xClose,iVar14,lVar19);
          if (iVar15 != 0) goto LAB_00137c15;
          lVar19 = lVar19 + iVar14;
          psVar18 = *(sqlite3_io_methods **)psVar18;
        } while (psVar18 != (sqlite3_io_methods *)0x0);
        iVar15 = 0;
      }
LAB_00137c15:
      iVar14 = iVar15;
      if ((psVar4 != (sqlite3_io_methods *)0x0) && (psVar18 = psVar4, iVar15 == 0)) {
        do {
          psVar10 = *(sqlite3_io_methods **)psVar18;
          sqlite3_free(psVar18);
          psVar18 = psVar10;
        } while (psVar10 != (sqlite3_io_methods *)0x0);
      }
    }
    if (iVar14 != 0) {
      if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
        (*pJfd->pMethods->xClose)(pJfd);
        pJfd->pMethods = (sqlite3_io_methods *)0x0;
      }
      pJfd->pMethods = psVar3;
      *(int *)&pJfd[1].pMethods = iVar1;
      *(int *)((long)&pJfd[1].pMethods + 4) = iVar16;
      pJfd[2].pMethods = psVar4;
      pJfd[3].pMethods = psVar5;
      pJfd[6].pMethods = psVar6;
      pJfd[4].pMethods = psVar11;
      pJfd[5].pMethods = psVar12;
      pJfd[7].pMethods = psVar7;
      pJfd[8].pMethods = psVar8;
      pJfd[9].pMethods = psVar9;
      if (iVar14 != 0) goto LAB_00137ccd;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      iVar16 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
      return iVar16;
    }
  }
  __stack_chk_fail();
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}